

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperloglog.cpp
# Opt level: O0

int duckdb_hll::hllSparseSet(robj *o,long index,uint8_t count)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  sds pcVar7;
  size_t sVar8;
  byte *pbVar9;
  byte in_DL;
  long in_RSI;
  long *in_RDI;
  bool bVar10;
  int dense_retval;
  int len_1;
  int v2;
  int v1;
  int scanlen;
  int curval;
  int _l_1;
  int _l;
  long oplen;
  int deltalen;
  int oldlen;
  int seqlen;
  int len;
  int last;
  uint8_t *n;
  uint8_t seq [5];
  long runlen;
  long is_val;
  long is_xzero;
  long is_zero;
  long span;
  long first;
  uint8_t *next;
  uint8_t *prev;
  uint8_t *p;
  uint8_t *end;
  uint8_t *sparse;
  uint8_t oldcount;
  hllhdr *hdr;
  byte *local_f0;
  byte *local_e8;
  int local_c8;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  sds in_stack_ffffffffffffff48;
  long lVar11;
  byte *local_98;
  byte local_8d [5];
  robj *o_00;
  long local_68;
  long local_60;
  byte *local_58;
  byte *local_50;
  byte *local_48;
  byte *local_40;
  int local_4;
  
  bVar2 = false;
  bVar1 = false;
  bVar10 = false;
  o_00 = (robj *)0x0;
  if (in_DL < 0x21) {
    pcVar7 = sdsMakeRoomFor(in_stack_ffffffffffffff48,
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    *in_RDI = (long)pcVar7;
    local_f0 = (byte *)(*in_RDI + 0x11);
    sVar8 = sdslen((sds)*in_RDI);
    local_40 = local_f0 + (sVar8 - 0x11);
    local_60 = 0;
    local_50 = (byte *)0x0;
    local_68 = 0;
    for (local_48 = local_f0; local_48 < local_40; local_48 = local_48 + lVar11) {
      lVar11 = 1;
      if ((*local_48 & 0xc0) == 0) {
        uVar4 = *local_48 & 0x3f;
      }
      else if ((*local_48 & 0x80) == 0) {
        uVar4 = (*local_48 & 0x3f) << 8 | (uint)local_48[1];
        lVar11 = 2;
      }
      else {
        uVar4 = *local_48 & 3;
      }
      local_68 = (long)(int)(uVar4 + 1);
      if (in_RSI <= local_60 + local_68 + -1) break;
      local_50 = local_48;
      local_60 = local_68 + local_60;
    }
    if (local_68 == 0) {
      return -1;
    }
    if ((*local_48 & 0xc0) == 0x40) {
      local_e8 = local_48 + 2;
    }
    else {
      local_e8 = local_48 + 1;
    }
    local_58 = local_e8;
    if (local_40 <= local_e8) {
      local_58 = (byte *)0x0;
    }
    if ((*local_48 & 0xc0) == 0) {
      bVar2 = true;
      uVar4 = *local_48 & 0x3f;
    }
    else {
      bVar10 = (*local_48 & 0xc0) != 0x40;
      if (bVar10) {
        uVar4 = *local_48 & 3;
      }
      else {
        uVar4 = (*local_48 & 0x3f) << 8 | (uint)local_48[1];
      }
      bVar1 = !bVar10;
    }
    o_00 = (robj *)(long)(int)(uVar4 + 1);
    if (bVar10) {
      if (in_DL <= (byte)(((byte)((int)(uint)*local_48 >> 2) & 0x1f) + 1)) {
        return 0;
      }
      if (o_00 != (robj *)0x1) goto LAB_02667bb4;
      *local_48 = (in_DL - 1) * '\x04' | 0x80;
    }
    else {
LAB_02667bb4:
      if ((bVar2) && (o_00 == (robj *)0x1)) {
        *local_48 = (in_DL - 1) * '\x04' | 0x80;
      }
      else {
        local_98 = local_8d;
        iVar6 = (int)local_60 + (int)local_68 + -1;
        if ((bVar2) || (bVar1)) {
          if (in_RSI != local_60) {
            iVar5 = (int)in_RSI - (int)local_60;
            if (iVar5 < 0x41) {
              local_8d[0] = (char)iVar5 - 1;
              local_98 = local_8d + 1;
            }
            else {
              local_8d[0] = (byte)((uint)(iVar5 + -1) >> 8) | 0x40;
              local_8d[1] = (byte)(iVar5 + -1);
              local_98 = local_8d + 2;
            }
          }
          *local_98 = (in_DL - 1) * '\x04' | 0x80;
          pbVar9 = local_98 + 1;
          if (in_RSI != iVar6) {
            iVar6 = iVar6 - (int)in_RSI;
            if (iVar6 < 0x41) {
              *pbVar9 = (char)iVar6 - 1;
              pbVar9 = local_98 + 2;
            }
            else {
              *pbVar9 = (byte)((uint)(iVar6 + -1) >> 8) | 0x40;
              local_98[2] = (byte)(iVar6 + -1);
              pbVar9 = local_98 + 3;
            }
          }
          local_98 = pbVar9;
        }
        else {
          bVar3 = (byte)((int)(uint)*local_48 >> 2) & 0x1f;
          if (in_RSI != local_60) {
            local_8d[0] = bVar3 * '\x04' | ((char)in_RSI - (char)local_60) - 1U | 0x80;
            local_98 = local_8d + 1;
          }
          *local_98 = (in_DL - 1) * '\x04' | 0x80;
          pbVar9 = local_98 + 1;
          if (in_RSI != iVar6) {
            local_98[1] = bVar3 * '\x04' | ((char)iVar6 - (char)in_RSI) - 1U | 0x80;
            pbVar9 = local_98 + 2;
          }
          local_98 = pbVar9;
        }
        local_98._0_4_ = (int)local_98 - (int)local_8d;
        iVar6 = 1;
        if (bVar1) {
          iVar6 = 2;
        }
        iVar6 = (int)local_98 - iVar6;
        if ((0 < iVar6) && (sVar8 = sdslen((sds)*in_RDI), 3000 < sVar8 + (long)iVar6))
        goto LAB_026681b2;
        if ((iVar6 != 0) && (local_58 != (byte *)0x0)) {
          memmove(local_58 + iVar6,local_58,(long)local_40 - (long)local_58);
        }
        sdsIncrLen((sds)*in_RDI,(long)iVar6);
        memcpy(local_48,local_8d,(long)(int)local_98);
        local_40 = local_40 + iVar6;
      }
    }
    if (local_50 != (byte *)0x0) {
      local_f0 = local_50;
    }
    local_48 = local_f0;
    local_c8 = 5;
    while( true ) {
      iVar6 = local_c8;
      if (local_48 < local_40) {
        local_c8 = local_c8 + -1;
      }
      if (local_48 >= local_40 || iVar6 == 0) break;
      if ((*local_48 & 0xc0) == 0x40) {
        local_48 = local_48 + 2;
      }
      else if ((*local_48 & 0xc0) == 0) {
        local_48 = local_48 + 1;
      }
      else if ((((local_48 + 1 < local_40) && ((local_48[1] & 0x80) != 0)) &&
               (iVar6 = ((int)(uint)*local_48 >> 2 & 0x1fU) + 1,
               iVar6 == ((int)(uint)local_48[1] >> 2 & 0x1fU) + 1)) &&
              (bVar3 = (*local_48 & 3) + (local_48[1] & 3) + 2, bVar3 < 5)) {
        local_48[1] = ((char)iVar6 + -1) * '\x04' | bVar3 - 1 | 0x80;
        memmove(local_48,local_48 + 1,(long)local_40 - (long)local_48);
        sdsIncrLen((sds)*in_RDI,-1);
        local_40 = local_40 + -1;
      }
      else {
        local_48 = local_48 + 1;
      }
    }
    *(byte *)(*in_RDI + 0xf) = *(byte *)(*in_RDI + 0xf) | 0x80;
    local_4 = 1;
  }
  else {
LAB_026681b2:
    iVar6 = hllSparseToDense(o_00);
    if (iVar6 == -1) {
      local_4 = -1;
    }
    else {
      local_4 = hllDenseSet((uint8_t *)(*in_RDI + 0x11),in_RSI,in_DL);
    }
  }
  return local_4;
}

Assistant:

int hllSparseSet(robj *o, long index, uint8_t count) {
    struct hllhdr *hdr;
    uint8_t oldcount, *sparse, *end, *p, *prev, *next;
    long first, span;
    long is_zero = 0, is_xzero = 0, is_val = 0, runlen = 0;
    uint8_t seq[5], *n;
    int last;
    int len;
    int seqlen;
    int oldlen;
    int deltalen;

    /* If the count is too big to be representable by the sparse representation
     * switch to dense representation. */
    if (count > HLL_SPARSE_VAL_MAX_VALUE) goto promote;

    /* When updating a sparse representation, sometimes we may need to
     * enlarge the buffer for up to 3 bytes in the worst case (XZERO split
     * into XZERO-VAL-XZERO). Make sure there is enough space right now
     * so that the pointers we take during the execution of the function
     * will be valid all the time. */
    o->ptr = (sds) sdsMakeRoomFor((sds) o->ptr,3);

    /* Step 1: we need to locate the opcode we need to modify to check
     * if a value update is actually needed. */
    sparse = p = ((uint8_t*)o->ptr) + HLL_HDR_SIZE;
    end = p + sdslen((sds) o->ptr) - HLL_HDR_SIZE;

    first = 0;
    prev = NULL; /* Points to previous opcode at the end of the loop. */
    next = NULL; /* Points to the next opcode at the end of the loop. */
    span = 0;
    while(p < end) {
        long oplen;

        /* Set span to the number of registers covered by this opcode.
         *
         * This is the most performance critical loop of the sparse
         * representation. Sorting the conditionals from the most to the
         * least frequent opcode in many-bytes sparse HLLs is faster. */
        oplen = 1;
        if (HLL_SPARSE_IS_ZERO(p)) {
            span = HLL_SPARSE_ZERO_LEN(p);
        } else if (HLL_SPARSE_IS_VAL(p)) {
            span = HLL_SPARSE_VAL_LEN(p);
        } else { /* XZERO. */
            span = HLL_SPARSE_XZERO_LEN(p);
            oplen = 2;
        }
        /* Break if this opcode covers the register as 'index'. */
        if (index <= first+span-1) break;
        prev = p;
        p += oplen;
        first += span;
    }
    if (span == 0) return -1; /* Invalid format. */

    next = HLL_SPARSE_IS_XZERO(p) ? p+2 : p+1;
    if (next >= end) next = NULL;

    /* Cache current opcode type to avoid using the macro again and
     * again for something that will not change.
     * Also cache the run-length of the opcode. */
    if (HLL_SPARSE_IS_ZERO(p)) {
        is_zero = 1;
        runlen = HLL_SPARSE_ZERO_LEN(p);
    } else if (HLL_SPARSE_IS_XZERO(p)) {
        is_xzero = 1;
        runlen = HLL_SPARSE_XZERO_LEN(p);
    } else {
        is_val = 1;
        runlen = HLL_SPARSE_VAL_LEN(p);
    }

    /* Step 2: After the loop:
     *
     * 'first' stores to the index of the first register covered
     *  by the current opcode, which is pointed by 'p'.
     *
     * 'next' ad 'prev' store respectively the next and previous opcode,
     *  or NULL if the opcode at 'p' is respectively the last or first.
     *
     * 'span' is set to the number of registers covered by the current
     *  opcode.
     *
     * There are different cases in order to update the data structure
     * in place without generating it from scratch:
     *
     * A) If it is a VAL opcode already set to a value >= our 'count'
     *    no update is needed, regardless of the VAL run-length field.
     *    In this case PFADD returns 0 since no changes are performed.
     *
     * B) If it is a VAL opcode with len = 1 (representing only our
     *    register) and the value is less than 'count', we just update it
     *    since this is a trivial case. */
    if (is_val) {
        oldcount = HLL_SPARSE_VAL_VALUE(p);
        /* Case A. */
        if (oldcount >= count) return 0;

        /* Case B. */
        if (runlen == 1) {
            HLL_SPARSE_VAL_SET(p,count,1);
            goto updated;
        }
    }

    /* C) Another trivial to handle case is a ZERO opcode with a len of 1.
     * We can just replace it with a VAL opcode with our value and len of 1. */
    if (is_zero && runlen == 1) {
        HLL_SPARSE_VAL_SET(p,count,1);
        goto updated;
    }

    /* D) General case.
     *
     * The other cases are more complex: our register requires to be updated
     * and is either currently represented by a VAL opcode with len > 1,
     * by a ZERO opcode with len > 1, or by an XZERO opcode.
     *
     * In those cases the original opcode must be split into multiple
     * opcodes. The worst case is an XZERO split in the middle resuling into
     * XZERO - VAL - XZERO, so the resulting sequence max length is
     * 5 bytes.
     *
     * We perform the split writing the new sequence into the 'new' buffer
     * with 'newlen' as length. Later the new sequence is inserted in place
     * of the old one, possibly moving what is on the right a few bytes
     * if the new sequence is longer than the older one. */
    n = seq;
    last = first+span-1; /* Last register covered by the sequence. */

    if (is_zero || is_xzero) {
        /* Handle splitting of ZERO / XZERO. */
        if (index != first) {
            len = index-first;
            if (len > HLL_SPARSE_ZERO_MAX_LEN) {
                HLL_SPARSE_XZERO_SET(n,len);
                n += 2;
            } else {
                HLL_SPARSE_ZERO_SET(n,len);
                n++;
            }
        }
        HLL_SPARSE_VAL_SET(n,count,1);
        n++;
        if (index != last) {
            len = last-index;
            if (len > HLL_SPARSE_ZERO_MAX_LEN) {
                HLL_SPARSE_XZERO_SET(n,len);
                n += 2;
            } else {
                HLL_SPARSE_ZERO_SET(n,len);
                n++;
            }
        }
    } else {
        /* Handle splitting of VAL. */
        int curval = HLL_SPARSE_VAL_VALUE(p);

        if (index != first) {
            len = index-first;
            HLL_SPARSE_VAL_SET(n,curval,len);
            n++;
        }
        HLL_SPARSE_VAL_SET(n,count,1);
        n++;
        if (index != last) {
            len = last-index;
            HLL_SPARSE_VAL_SET(n,curval,len);
            n++;
        }
    }

    /* Step 3: substitute the new sequence with the old one.
     *
     * Note that we already allocated space on the sds string
     * calling sdsMakeRoomFor(). */
     seqlen = n-seq;
     oldlen = is_xzero ? 2 : 1;
     deltalen = seqlen-oldlen;

     if (deltalen > 0 &&
         sdslen((sds) o->ptr)+deltalen > HLL_SPARSE_MAX_BYTES) goto promote;
     if (deltalen && next) memmove(next+deltalen,next,end-next);
     sdsIncrLen((sds) o->ptr,deltalen);
     memcpy(p,seq,seqlen);
     end += deltalen;

updated: {
    /* Step 4: Merge adjacent values if possible.
     *
     * The representation was updated, however the resulting representation
     * may not be optimal: adjacent VAL opcodes can sometimes be merged into
     * a single one. */
    p = prev ? prev : sparse;
    int scanlen = 5; /* Scan up to 5 upcodes starting from prev. */
    while (p < end && scanlen--) {
        if (HLL_SPARSE_IS_XZERO(p)) {
            p += 2;
            continue;
        } else if (HLL_SPARSE_IS_ZERO(p)) {
            p++;
            continue;
        }
        /* We need two adjacent VAL opcodes to try a merge, having
         * the same value, and a len that fits the VAL opcode max len. */
        if (p+1 < end && HLL_SPARSE_IS_VAL(p+1)) {
            int v1 = HLL_SPARSE_VAL_VALUE(p);
            int v2 = HLL_SPARSE_VAL_VALUE(p+1);
            if (v1 == v2) {
                int len = HLL_SPARSE_VAL_LEN(p)+HLL_SPARSE_VAL_LEN(p+1);
                if (len <= HLL_SPARSE_VAL_MAX_LEN) {
                    HLL_SPARSE_VAL_SET(p+1,v1,len);
                    memmove(p,p+1,end-p);
                    sdsIncrLen((sds) o->ptr,-1);
                    end--;
                    /* After a merge we reiterate without incrementing 'p'
                     * in order to try to merge the just merged value with
                     * a value on its right. */
                    continue;
                }
            }
        }
        p++;
    }

    /* Invalidate the cached cardinality. */
    hdr = (struct hllhdr *) o->ptr;
    HLL_INVALIDATE_CACHE(hdr);
    return 1;
}
promote: /* Promote to dense representation. */
    if (hllSparseToDense(o) == HLL_C_ERR) return -1; /* Corrupted HLL. */
    hdr = (struct hllhdr *) o->ptr;

    /* We need to call hllDenseAdd() to perform the operation after the
     * conversion. However the result must be 1, since if we need to
     * convert from sparse to dense a register requires to be updated.
     *
     * Note that this in turn means that PFADD will make sure the command
     * is propagated to slaves / AOF, so if there is a sparse -> dense
     * conversion, it will be performed in all the slaves as well. */
    int dense_retval = hllDenseSet(hdr->registers + 1,index,count);
    assert(dense_retval == 1);
    return dense_retval;
}